

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderDesc.cpp
# Opt level: O0

Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
renderdesc::Loader::loadFramebuffers_abi_cxx11_
          (Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,Loader *this)

{
  PixelType type;
  uint uVar1;
  bool bVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  reference_wrapper<const_yaml::Mapping> *this_00;
  Mapping *pMVar4;
  KeyValue *pKVar5;
  reference_wrapper *prVar6;
  size_type sVar7;
  size_type sVar8;
  const_reference pvVar9;
  long *plVar10;
  vector<yaml::Value,_std::allocator<yaml::Value>_> *this_01;
  undefined8 uVar11;
  size_type sVar12;
  undefined8 uVar13;
  PixelType *pPVar14;
  Value *v;
  bool local_b0a;
  Index local_a2c;
  int local_a24;
  int index_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a18;
  int local_9f8;
  int local_9f4;
  int index_1;
  int i;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9e8;
  int local_9c4;
  undefined1 local_9c0 [4];
  int index;
  Texture local_9a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_970;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_950;
  undefined1 local_930 [8];
  Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  result_2;
  Texture local_8e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_898;
  undefined1 local_878 [8];
  Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  result_1;
  Texture local_830;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_800;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7e0;
  undefined1 local_7c0 [8];
  Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  result;
  Texture texture;
  size_t tex_index;
  undefined1 local_758 [4];
  PixelType tex_type;
  Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_738;
  undefined1 local_718 [8];
  Expected<PixelType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  tex_type_result;
  Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_6d0;
  type *local_6b0;
  type *tex_type_name;
  type *tex_name;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yaml::Value>
  *local_698;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_690;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_670;
  Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_650;
  Mapping *local_630;
  Mapping *tex;
  Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_608;
  undefined1 local_5e8 [8];
  ExpectedRef<const_Mapping,_std::string> tex_result;
  Value *ytex;
  const_iterator __end3;
  const_iterator __begin3;
  Sequence *__range3;
  int iStack_598;
  Framebuffer fb;
  Sequence *ytextures;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_560;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_540;
  Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_520;
  allocator<char> local_4f9;
  string local_4f8;
  undefined1 local_4d8 [8];
  ExpectedRef<const_Sequence,_std::string> textures_result;
  undefined1 local_4a8 [6];
  bool pingpong;
  undefined1 local_488 [8];
  Expected<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  pingpong_result;
  undefined1 local_458 [4];
  int height;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_438;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_418;
  Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3f8;
  undefined1 local_3d8 [8];
  Expected<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  height_result;
  undefined1 local_3a8 [4];
  int width;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_388;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_368;
  Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_348;
  undefined1 local_328 [8];
  Expected<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  width_result;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2c0;
  vector<yaml::Value,_std::allocator<yaml::Value>_> *local_2a0;
  Sequence *size;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_238;
  allocator<char> local_211;
  string local_210;
  undefined1 local_1f0 [8];
  ExpectedRef<const_Sequence,_std::string> size_result;
  size_t framebuffer_index;
  Mapping *yfb;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_178;
  undefined1 local_158 [8];
  ExpectedRef<const_Mapping,_std::string> yfb_result;
  Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_110;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_e8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_e0;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_d8;
  type *local_d0;
  type *yfbv;
  type *name;
  _Self local_b8;
  const_iterator __end2;
  const_iterator __begin2;
  KeyValue *__range2;
  Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_98;
  allocator<char> local_61;
  string local_60;
  undefined1 local_40 [8];
  ExpectedRef<const_Mapping,_std::string> map_fb_result;
  Loader *this_local;
  
  pMVar4 = this->root_;
  map_fb_result._32_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"framebuffers",&local_61);
  yaml::Mapping::getMapping((ExpectedRef<const_Mapping,_std::string> *)local_40,pMVar4,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator(&local_61);
  bVar2 = ::Expected::operator_cast_to_bool((Expected *)local_40);
  if (bVar2) {
    this_00 = Expected<std::reference_wrapper<const_yaml::Mapping>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::value((Expected<std::reference_wrapper<const_yaml::Mapping>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)local_40);
    pMVar4 = std::reference_wrapper<const_yaml::Mapping>::get(this_00);
    pKVar5 = yaml::Mapping::map_abi_cxx11_(pMVar4);
    __end2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yaml::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yaml::Value>_>_>
             ::begin(pKVar5);
    local_b8._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yaml::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yaml::Value>_>_>
         ::end(pKVar5);
    while (bVar2 = std::operator!=(&__end2,&local_b8), bVar2) {
      name = &std::
              _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yaml::Value>_>
              ::operator*(&__end2)->first;
      yfbv = (type *)std::get<0ul,std::__cxx11::string_const,yaml::Value>
                               ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yaml::Value>
                                 *)name);
      local_d0 = std::get<1ul,std::__cxx11::string_const,yaml::Value>
                           ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yaml::Value>
                             *)name);
      local_e0._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(&(this->names_).framebuffer);
      local_e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::end(&(this->names_).framebuffer);
      local_d8 = std::
                 find<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::__cxx11::string>
                           (local_e0,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                      )local_e8,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            yfbv);
      local_f0._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(&(this->names_).framebuffer);
      bVar2 = __gnu_cxx::operator!=(&local_d8,&local_f0);
      if (bVar2) {
        uVar11 = std::__cxx11::string::c_str();
        format_abi_cxx11_((string *)&yfb_result.has_value_,"Framebuffer \'%s\' is not unique",uVar11
                         );
        Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::Unexpected(&local_110,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &yfb_result.has_value_);
        Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::Expected(__return_storage_ptr__,&local_110);
        Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~Unexpected(&local_110);
        std::__cxx11::string::~string((string *)&yfb_result.has_value_);
        goto LAB_0014dd36;
      }
      yaml::Value::getMapping_abi_cxx11_
                ((ExpectedRef<const_Mapping,_std::string> *)local_158,local_d0);
      bVar2 = ::Expected::operator_cast_to_bool((Expected *)local_158);
      if (bVar2) {
        prVar6 = (reference_wrapper *)
                 Expected<std::reference_wrapper<const_yaml::Mapping>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::value((Expected<std::reference_wrapper<const_yaml::Mapping>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)local_158);
        pMVar4 = std::reference_wrapper::operator_cast_to_Mapping_(prVar6);
        sVar7 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size(&(this->names_).framebuffer);
        size_result._32_8_ = sVar7;
        sVar8 = std::vector<renderdesc::Framebuffer,_std::allocator<renderdesc::Framebuffer>_>::size
                          (&this->pipeline_->framebuffers);
        if (sVar7 != sVar8) {
          __assert_fail("framebuffer_index == pipeline_.framebuffers.size()",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/w23[P]stameska/src/RenderDesc.cpp"
                        ,0x99,"Expected<void, std::string> renderdesc::Loader::loadFramebuffers()");
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_210,"size",&local_211);
        yaml::Mapping::getSequence
                  ((ExpectedRef<const_Sequence,_std::string> *)local_1f0,pMVar4,&local_210);
        std::__cxx11::string::~string((string *)&local_210);
        std::allocator<char>::~allocator(&local_211);
        bVar2 = ::Expected::operator_cast_to_bool((Expected *)local_1f0);
        if (bVar2) {
          prVar6 = (reference_wrapper *)
                   Expected<std::reference_wrapper<const_std::vector<yaml::Value,_std::allocator<yaml::Value>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::value((Expected<std::reference_wrapper<const_std::vector<yaml::Value,_std::allocator<yaml::Value>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)local_1f0);
          local_2a0 = std::reference_wrapper::operator_cast_to_vector_(prVar6);
          sVar7 = std::vector<yaml::Value,_std::allocator<yaml::Value>_>::size(local_2a0);
          if (sVar7 == 2) {
            pvVar9 = std::vector<yaml::Value,_std::allocator<yaml::Value>_>::operator[](local_2a0,0)
            ;
            readVariable_abi_cxx11_
                      ((Expected<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_328,this,pvVar9);
            bVar2 = ::Expected::operator_cast_to_bool((Expected *)local_328);
            if (bVar2) {
              plVar10 = Expected<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::value((Expected<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)local_328);
              height_result._36_4_ = *(undefined4 *)plVar10;
              pvVar9 = std::vector<yaml::Value,_std::allocator<yaml::Value>_>::operator[]
                                 (local_2a0,1);
              readVariable_abi_cxx11_
                        ((Expected<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)local_3d8,this,pvVar9);
              bVar2 = ::Expected::operator_cast_to_bool((Expected *)local_3d8);
              if (bVar2) {
                plVar10 = Expected<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::value((Expected<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)local_3d8);
                pingpong_result._36_4_ = *(undefined4 *)plVar10;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)local_4a8,"pingpong",
                           (allocator<char> *)&textures_result.field_0x27);
                yaml::Mapping::getInt
                          ((Expected<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)local_488,pMVar4,(string *)local_4a8);
                std::__cxx11::string::~string((string *)local_4a8);
                std::allocator<char>::~allocator((allocator<char> *)&textures_result.field_0x27);
                bVar2 = ::Expected::operator_cast_to_bool((Expected *)local_488);
                local_b0a = false;
                if (bVar2) {
                  plVar10 = Expected<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::value((Expected<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     *)local_488);
                  local_b0a = *plVar10 != 0;
                }
                textures_result._38_1_ = local_b0a;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_4f8,"textures",&local_4f9);
                yaml::Mapping::getSequence
                          ((ExpectedRef<const_Sequence,_std::string> *)local_4d8,pMVar4,&local_4f8);
                std::__cxx11::string::~string((string *)&local_4f8);
                std::allocator<char>::~allocator(&local_4f9);
                bVar2 = ::Expected::operator_cast_to_bool((Expected *)local_4d8);
                if (bVar2) {
                  prVar6 = (reference_wrapper *)
                           Expected<std::reference_wrapper<const_std::vector<yaml::Value,_std::allocator<yaml::Value>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           ::value((Expected<std::reference_wrapper<const_std::vector<yaml::Value,_std::allocator<yaml::Value>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)local_4d8);
                  this_01 = std::reference_wrapper::operator_cast_to_vector_(prVar6);
                  __range3._4_4_ = 0;
                  fb.textures._8_8_ = this_01;
                  __end3 = std::vector<yaml::Value,_std::allocator<yaml::Value>_>::begin(this_01);
                  ytex = (Value *)std::vector<yaml::Value,_std::allocator<yaml::Value>_>::end
                                            (this_01);
                  while (bVar2 = __gnu_cxx::operator!=
                                           (&__end3,(
                                                  __normal_iterator<const_yaml::Value_*,_std::vector<yaml::Value,_std::allocator<yaml::Value>_>_>
                                                  *)&ytex), bVar2) {
                    tex_result._32_8_ =
                         __gnu_cxx::
                         __normal_iterator<const_yaml::Value_*,_std::vector<yaml::Value,_std::allocator<yaml::Value>_>_>
                         ::operator*(&__end3);
                    yaml::Value::getMapping_abi_cxx11_
                              ((ExpectedRef<const_Mapping,_std::string> *)local_5e8,
                               (Value *)tex_result._32_8_);
                    bVar2 = ::Expected::operator_cast_to_bool((Expected *)local_5e8);
                    uVar1 = __range3._4_4_;
                    if (bVar2) {
                      prVar6 = (reference_wrapper *)
                               Expected<std::reference_wrapper<const_yaml::Mapping>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               ::value((Expected<std::reference_wrapper<const_yaml::Mapping>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)local_5e8);
                      local_630 = std::reference_wrapper::operator_cast_to_Mapping_(prVar6);
                      pKVar5 = yaml::Mapping::map_abi_cxx11_(local_630);
                      sVar12 = std::
                               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yaml::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yaml::Value>_>_>
                               ::size(pKVar5);
                      if (sVar12 == 1) {
                        pKVar5 = yaml::Mapping::map_abi_cxx11_(local_630);
                        tex_name = (type *)std::
                                           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yaml::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yaml::Value>_>_>
                                           ::begin(pKVar5);
                        local_698 = std::
                                    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yaml::Value>_>
                                    ::operator*((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yaml::Value>_>
                                                 *)&tex_name);
                        tex_type_name =
                             (type *)std::get<0ul,std::__cxx11::string_const,yaml::Value>(local_698)
                        ;
                        local_6b0 = std::get<1ul,std::__cxx11::string_const,yaml::Value>(local_698);
                        if ((int)__range3._4_4_ < 4) {
                          pixelTypeFromValue_abi_cxx11_
                                    ((Expected<PixelType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      *)local_718,(renderdesc *)local_6b0,v);
                          bVar2 = ::Expected::operator_cast_to_bool((Expected *)local_718);
                          if (bVar2) {
                            pPVar14 = Expected<PixelType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      ::value((Expected<PixelType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                               *)local_718);
                            type = *pPVar14;
                            sVar7 = std::
                                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ::size(&(this->names_).texture);
                            sVar8 = std::
                                    vector<renderdesc::Texture,_std::allocator<renderdesc::Texture>_>
                                    ::size(&this->pipeline_->textures);
                            if (sVar7 != sVar8) {
                              __assert_fail("tex_index == pipeline_.textures.size()",
                                            "/workspace/llm4binary/github/license_all_cmakelists_1510/w23[P]stameska/src/RenderDesc.cpp"
                                            ,0xca,
                                            "Expected<void, std::string> renderdesc::Loader::loadFramebuffers()"
                                           );
                            }
                            Texture::Texture((Texture *)&result.has_value_,height_result._36_4_,
                                             pingpong_result._36_4_,type);
                            texture.file.field_2._8_4_ = (undefined4)sVar7;
                            if ((textures_result._38_1_ & 1) == 0) {
                              std::operator+(&local_970,
                                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)yfbv,".");
                              std::operator+(&local_950,&local_970,
                                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)tex_type_name);
                              Texture::Texture(&local_9a0,(Texture *)&result.has_value_);
                              registerTexture((Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                               *)local_930,this,texture.file.field_2._8_4_,Fixed,
                                              &local_950,&local_9a0);
                              Texture::~Texture(&local_9a0);
                              std::__cxx11::string::~string((string *)&local_950);
                              std::__cxx11::string::~string((string *)&local_970);
                              bVar2 = ::Expected::operator_cast_to_bool((Expected *)local_930);
                              if (!bVar2) {
                                pbVar3 = Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                         ::error((Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)local_930);
                                Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::Unexpected((Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)local_9c0,pbVar3);
                                Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::Expected(__return_storage_ptr__,(UnexpectedType *)local_9c0);
                                Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::~Unexpected((Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                               *)local_9c0);
                              }
                              Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::~Expected((Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                           *)local_930);
joined_r0x0014d907:
                              bVar2 = !bVar2;
                              if (!bVar2) {
                                fb.textures[(long)(int)__range3._4_4_ + -2] =
                                     texture.file.field_2._8_4_;
                                __range3._4_4_ = __range3._4_4_ + 1;
                                bVar2 = false;
                              }
                            }
                            else {
                              std::operator+(&local_800,
                                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)yfbv,"@ping.");
                              std::operator+(&local_7e0,&local_800,
                                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)tex_type_name);
                              Texture::Texture(&local_830,(Texture *)&result.has_value_);
                              registerTexture((Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                               *)local_7c0,this,texture.file.field_2._8_4_,Ping,
                                              &local_7e0,&local_830);
                              Texture::~Texture(&local_830);
                              std::__cxx11::string::~string((string *)&local_7e0);
                              std::__cxx11::string::~string((string *)&local_800);
                              bVar2 = ::Expected::operator_cast_to_bool((Expected *)local_7c0);
                              if (!bVar2) {
                                pbVar3 = Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                         ::error((Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)local_7c0);
                                Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::Unexpected((Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)&result_1.has_value_,pbVar3);
                                Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::Expected(__return_storage_ptr__,
                                           (UnexpectedType *)&result_1.has_value_);
                                Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::~Unexpected((Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                               *)&result_1.has_value_);
                              }
                              bVar2 = !bVar2;
                              Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::~Expected((Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                           *)local_7c0);
                              if (!bVar2) {
                                std::operator+(&local_8b8,
                                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)yfbv,"@pong.");
                                std::operator+(&local_898,&local_8b8,
                                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)tex_type_name);
                                Texture::Texture(&local_8e8,(Texture *)&result.has_value_);
                                registerTexture((Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                 *)local_878,this,texture.file.field_2._8_4_,Pong,
                                                &local_898,&local_8e8);
                                Texture::~Texture(&local_8e8);
                                std::__cxx11::string::~string((string *)&local_898);
                                std::__cxx11::string::~string((string *)&local_8b8);
                                bVar2 = ::Expected::operator_cast_to_bool((Expected *)local_878);
                                if (!bVar2) {
                                  pbVar3 = Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                           ::error((
                                                  Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)local_878);
                                  Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  ::Unexpected((Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                *)&result_2.has_value_,pbVar3);
                                  Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  ::Expected(__return_storage_ptr__,
                                             (UnexpectedType *)&result_2.has_value_);
                                  Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  ::~Unexpected((Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                 *)&result_2.has_value_);
                                }
                                Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::~Expected((Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                             *)local_878);
                                goto joined_r0x0014d907;
                              }
                            }
                            Texture::~Texture((Texture *)&result.has_value_);
                          }
                          else {
                            uVar11 = std::__cxx11::string::c_str();
                            uVar1 = __range3._4_4_;
                            Expected<PixelType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::error((Expected<PixelType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     *)local_718);
                            uVar13 = std::__cxx11::string::c_str();
                            format_abi_cxx11_((string *)local_758,
                                              "Framebuffer %s texture %d has invalid pixel type: %s"
                                              ,uVar11,(ulong)uVar1,uVar13);
                            Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::Unexpected(&local_738,
                                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)local_758);
                            Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::Expected(__return_storage_ptr__,&local_738);
                            Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::~Unexpected(&local_738);
                            std::__cxx11::string::~string((string *)local_758);
                            bVar2 = true;
                          }
                          Expected<PixelType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::~Expected((Expected<PixelType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                       *)local_718);
                        }
                        else {
                          uVar11 = std::__cxx11::string::c_str();
                          format_abi_cxx11_((string *)&tex_type_result.has_value_,
                                            "Too many targets for framebuffer %s, max: %d",uVar11,4)
                          ;
                          Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::Unexpected(&local_6d0,
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&tex_type_result.has_value_);
                          Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::Expected(__return_storage_ptr__,&local_6d0);
                          Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::~Unexpected(&local_6d0);
                          std::__cxx11::string::~string((string *)&tex_type_result.has_value_);
                          bVar2 = true;
                        }
                      }
                      else {
                        std::operator+(&local_690,"Framebuffer ",
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)yfbv);
                        std::operator+(&local_670,&local_690,
                                       " target texture should have only one key:value pair: name and format"
                                      );
                        Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::Unexpected(&local_650,&local_670);
                        Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::Expected(__return_storage_ptr__,&local_650);
                        Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::~Unexpected(&local_650);
                        std::__cxx11::string::~string((string *)&local_670);
                        std::__cxx11::string::~string((string *)&local_690);
                        bVar2 = true;
                      }
                    }
                    else {
                      uVar11 = std::__cxx11::string::c_str();
                      format_abi_cxx11_((string *)&tex,
                                        "%dth texture of framebuffer %s is not a mapping",
                                        (ulong)uVar1,uVar11);
                      Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::Unexpected(&local_608,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&tex);
                      Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::Expected(__return_storage_ptr__,&local_608);
                      Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::~Unexpected(&local_608);
                      std::__cxx11::string::~string((string *)&tex);
                      bVar2 = true;
                    }
                    Expected<std::reference_wrapper<const_yaml::Mapping>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::~Expected((Expected<std::reference_wrapper<const_yaml::Mapping>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)local_5e8);
                    if (bVar2) goto LAB_0014dc6d;
                    __gnu_cxx::
                    __normal_iterator<const_yaml::Value_*,_std::vector<yaml::Value,_std::allocator<yaml::Value>_>_>
                    ::operator++(&__end3);
                  }
                  if ((textures_result._38_1_ & 1) == 0) {
                    sVar7 = std::
                            vector<renderdesc::Framebuffer,_std::allocator<renderdesc::Framebuffer>_>
                            ::size(&this->pipeline_->framebuffers);
                    local_a24 = (int)sVar7;
                    std::vector<renderdesc::Framebuffer,_std::allocator<renderdesc::Framebuffer>_>::
                    push_back(&this->pipeline_->framebuffers,(value_type *)((long)&__range3 + 4));
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::push_back(&(this->names_).framebuffer,(value_type *)yfbv);
                    Command::Index::Index(&local_a2c,local_a24,Fixed);
                    std::
                    vector<renderdesc::Command::Index,_std::allocator<renderdesc::Command::Index>_>
                    ::emplace_back<renderdesc::Command::Index>
                              (&(this->indexes_).framebuffer,&local_a2c);
                  }
                  else {
                    sVar7 = std::
                            vector<renderdesc::Framebuffer,_std::allocator<renderdesc::Framebuffer>_>
                            ::size(&this->pipeline_->framebuffers);
                    local_9c4 = (int)sVar7;
                    std::vector<renderdesc::Framebuffer,_std::allocator<renderdesc::Framebuffer>_>::
                    push_back(&this->pipeline_->framebuffers,(value_type *)((long)&__range3 + 4));
                    std::operator+(&local_9e8,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)yfbv,"@ping");
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::push_back(&(this->names_).framebuffer,&local_9e8);
                    std::__cxx11::string::~string((string *)&local_9e8);
                    Command::Index::Index((Index *)&index_1,local_9c4,Ping);
                    std::
                    vector<renderdesc::Command::Index,_std::allocator<renderdesc::Command::Index>_>
                    ::emplace_back<renderdesc::Command::Index>
                              (&(this->indexes_).framebuffer,(Index *)&index_1);
                    for (local_9f4 = 0; local_9f4 < (int)__range3._4_4_; local_9f4 = local_9f4 + 1)
                    {
                      fb.textures[(long)local_9f4 + -2] = fb.textures[(long)local_9f4 + -2] + 1;
                    }
                    sVar7 = std::
                            vector<renderdesc::Framebuffer,_std::allocator<renderdesc::Framebuffer>_>
                            ::size(&this->pipeline_->framebuffers);
                    local_9f8 = (int)sVar7;
                    std::vector<renderdesc::Framebuffer,_std::allocator<renderdesc::Framebuffer>_>::
                    push_back(&this->pipeline_->framebuffers,(value_type *)((long)&__range3 + 4));
                    std::operator+(&local_a18,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)yfbv,"@pong");
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::push_back(&(this->names_).framebuffer,&local_a18);
                    std::__cxx11::string::~string((string *)&local_a18);
                    Command::Index::Index((Index *)&stack0xfffffffffffff5e0,local_9f8,Fixed);
                    std::
                    vector<renderdesc::Command::Index,_std::allocator<renderdesc::Command::Index>_>
                    ::emplace_back<renderdesc::Command::Index>
                              (&(this->indexes_).framebuffer,(Index *)&stack0xfffffffffffff5e0);
                  }
                  bVar2 = false;
                }
                else {
                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&ytextures,"Cannot read target textures for framebuffer ",
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)yfbv);
                  std::operator+(&local_560,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&ytextures,": ");
                  pbVar3 = Expected<std::reference_wrapper<const_std::vector<yaml::Value,_std::allocator<yaml::Value>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           ::error((Expected<std::reference_wrapper<const_std::vector<yaml::Value,_std::allocator<yaml::Value>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)local_4d8);
                  std::operator+(&local_540,&local_560,pbVar3);
                  Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::Unexpected(&local_520,&local_540);
                  Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::Expected(__return_storage_ptr__,&local_520);
                  Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::~Unexpected(&local_520);
                  std::__cxx11::string::~string((string *)&local_540);
                  std::__cxx11::string::~string((string *)&local_560);
                  std::__cxx11::string::~string((string *)&ytextures);
                  bVar2 = true;
                }
LAB_0014dc6d:
                Expected<std::reference_wrapper<const_std::vector<yaml::Value,_std::allocator<yaml::Value>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::~Expected((Expected<std::reference_wrapper<const_std::vector<yaml::Value,_std::allocator<yaml::Value>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)local_4d8);
                Expected<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::~Expected((Expected<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)local_488);
              }
              else {
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_458,"Cannot read height for framebuffer ",
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               yfbv);
                std::operator+(&local_438,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_458,": ");
                pbVar3 = Expected<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         ::error((Expected<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)local_3d8);
                std::operator+(&local_418,&local_438,pbVar3);
                Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::Unexpected(&local_3f8,&local_418);
                Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::Expected(__return_storage_ptr__,&local_3f8);
                Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::~Unexpected(&local_3f8);
                std::__cxx11::string::~string((string *)&local_418);
                std::__cxx11::string::~string((string *)&local_438);
                std::__cxx11::string::~string((string *)local_458);
                bVar2 = true;
              }
              Expected<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~Expected((Expected<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)local_3d8);
            }
            else {
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_3a8,"Cannot read width for framebuffer ",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             yfbv);
              std::operator+(&local_388,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_3a8,": ");
              pbVar3 = Expected<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ::error((Expected<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)local_328);
              std::operator+(&local_368,&local_388,pbVar3);
              Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::Unexpected(&local_348,&local_368);
              Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::Expected(__return_storage_ptr__,&local_348);
              Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~Unexpected(&local_348);
              std::__cxx11::string::~string((string *)&local_368);
              std::__cxx11::string::~string((string *)&local_388);
              std::__cxx11::string::~string((string *)local_3a8);
              bVar2 = true;
            }
            Expected<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~Expected((Expected<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)local_328);
          }
          else {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &width_result.has_value_,"Framebuffer ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)yfbv
                          );
            std::operator+(&local_2e0,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &width_result.has_value_," size must have 2 elements");
            Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::Unexpected(&local_2c0,&local_2e0);
            Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::Expected(__return_storage_ptr__,&local_2c0);
            Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~Unexpected(&local_2c0);
            std::__cxx11::string::~string((string *)&local_2e0);
            std::__cxx11::string::~string((string *)&width_result.has_value_);
            bVar2 = true;
          }
        }
        else {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&size,
                         "Cannot read size for framebuffer ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)yfbv);
          std::operator+(&local_278,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&size,
                         ": ");
          pbVar3 = Expected<std::reference_wrapper<const_std::vector<yaml::Value,_std::allocator<yaml::Value>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::error((Expected<std::reference_wrapper<const_std::vector<yaml::Value,_std::allocator<yaml::Value>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)local_1f0);
          std::operator+(&local_258,&local_278,pbVar3);
          Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::Unexpected(&local_238,&local_258);
          Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::Expected(__return_storage_ptr__,&local_238);
          Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~Unexpected(&local_238);
          std::__cxx11::string::~string((string *)&local_258);
          std::__cxx11::string::~string((string *)&local_278);
          std::__cxx11::string::~string((string *)&size);
          bVar2 = true;
        }
        Expected<std::reference_wrapper<const_std::vector<yaml::Value,_std::allocator<yaml::Value>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~Expected((Expected<std::reference_wrapper<const_std::vector<yaml::Value,_std::allocator<yaml::Value>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)local_1f0);
      }
      else {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&yfb,
                       "Framebuffer ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)yfbv);
        std::operator+(&local_198,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&yfb,
                       " desc object is not a mapping");
        Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::Unexpected(&local_178,&local_198);
        Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::Expected(__return_storage_ptr__,&local_178);
        Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~Unexpected(&local_178);
        std::__cxx11::string::~string((string *)&local_198);
        std::__cxx11::string::~string((string *)&yfb);
        bVar2 = true;
      }
      Expected<std::reference_wrapper<const_yaml::Mapping>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~Expected((Expected<std::reference_wrapper<const_yaml::Mapping>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_158);
      if (bVar2) goto LAB_0014dd36;
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yaml::Value>_>
      ::operator++(&__end2);
    }
    Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::Expected(__return_storage_ptr__);
  }
  else {
    pbVar3 = Expected<std::reference_wrapper<const_yaml::Mapping>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::error((Expected<std::reference_wrapper<const_yaml::Mapping>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_40);
    Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    Unexpected(&local_98,pbVar3);
    Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::Expected(__return_storage_ptr__,&local_98);
    Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~Unexpected(&local_98);
  }
LAB_0014dd36:
  Expected<std::reference_wrapper<const_yaml::Mapping>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~Expected((Expected<std::reference_wrapper<const_yaml::Mapping>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)local_40);
  return __return_storage_ptr__;
}

Assistant:

Expected<void, std::string> loadFramebuffers() {
		auto map_fb_result = root_.getMapping("framebuffers");
		if (!map_fb_result)
			return Unexpected(map_fb_result.error());

		for (const auto &[name, yfbv]: map_fb_result.value().get().map()) {
			if (std::find(names_.framebuffer.begin(), names_.framebuffer.end(), name) != names_.framebuffer.end())
				return Unexpected(format("Framebuffer '%s' is not unique", name.c_str()));

			auto yfb_result = yfbv.getMapping();
			if (!yfb_result)
				return Unexpected("Framebuffer " + name + " desc object is not a mapping");
			const yaml::Mapping &yfb = yfb_result.value();

			const size_t framebuffer_index = names_.framebuffer.size();
			assert(framebuffer_index == pipeline_.framebuffers.size());

			auto size_result = yfb.getSequence("size");
			if (!size_result)
				return Unexpected("Cannot read size for framebuffer " + name + ": " + size_result.error());
			const yaml::Sequence &size = size_result.value();

			if (size.size() != 2)
				return Unexpected("Framebuffer " + name + " size must have 2 elements");

			auto width_result = readVariable(size[0]);
			if (!width_result)
				return Unexpected("Cannot read width for framebuffer " + name + ": " + width_result.error());
			const int width = width_result.value();

			auto height_result = readVariable(size[1]);
			if (!height_result)
				return Unexpected("Cannot read height for framebuffer " + name + ": " + height_result.error());
			const int height = height_result.value();

			const auto pingpong_result = yfb.getInt("pingpong");
			const bool pingpong = pingpong_result && pingpong_result.value();

			auto textures_result = yfb.getSequence("textures");
			if (!textures_result)
				return Unexpected("Cannot read target textures for framebuffer " + name + ": " + textures_result.error());
			const yaml::Sequence &ytextures = textures_result.value();
			Framebuffer fb;
			fb.textures_count = 0;
			for (const auto &ytex: ytextures) {
				auto tex_result = ytex.getMapping();
				if (!tex_result)
					return Unexpected(format("%dth texture of framebuffer %s is not a mapping", fb.textures_count, name.c_str()));
				const yaml::Mapping &tex = tex_result.value();
				if (tex.map().size() != 1)
					return Unexpected("Framebuffer " + name + " target texture should have only one key:value pair: name and format");

				const auto &[tex_name, tex_type_name] = *tex.map().begin();
				if (fb.textures_count >= MAX_TARGET_TEXTURES)
					return Unexpected(format("Too many targets for framebuffer %s, max: %d",
						name.c_str(), MAX_TARGET_TEXTURES));

				auto tex_type_result = pixelTypeFromValue(tex_type_name);
				if (!tex_type_result)
					return Unexpected(format("Framebuffer %s texture %d has invalid pixel type: %s",
						name.c_str(), fb.textures_count, tex_type_result.error().c_str()));
				const PixelType tex_type = tex_type_result.value();

				const size_t tex_index = names_.texture.size();
				assert(tex_index == pipeline_.textures.size());

				Texture texture{width, height, tex_type};
				if (pingpong) {
					{
						auto result = registerTexture(tex_index, Command::Index::Pingpong::Ping, name + "@ping." + tex_name, texture);
						if (!result)
							return Unexpected(result.error());
					}

					{
						auto result = registerTexture(tex_index, Command::Index::Pingpong::Pong, name + "@pong." + tex_name, texture);
						if (!result)
							return Unexpected(result.error());
					}
				} else {
					auto result = registerTexture(tex_index, Command::Index::Pingpong::Fixed, name + "." + tex_name, texture);
					if (!result)
						return Unexpected(result.error());
				}

				fb.textures[fb.textures_count] = (int)tex_index;
				++fb.textures_count;
			}

			if (pingpong) {
				{
					const int index = (int)pipeline_.framebuffers.size();
					pipeline_.framebuffers.push_back(fb);
					names_.framebuffer.push_back(name + "@ping");
					indexes_.framebuffer.emplace_back(Command::Index(index, Command::Index::Pingpong::Ping));
				}

				for (int i = 0; i < fb.textures_count; ++i)
					fb.textures[i] += 1;

				{
					const int index = (int)pipeline_.framebuffers.size();
					pipeline_.framebuffers.push_back(fb);
					names_.framebuffer.push_back(name + "@pong");
					indexes_.framebuffer.emplace_back(Command::Index(index));
				}
			} else {
				const int index = (int)pipeline_.framebuffers.size();
				pipeline_.framebuffers.push_back(fb);
				names_.framebuffer.push_back(name);
				indexes_.framebuffer.emplace_back(Command::Index(index));
			}
		}

		return Expected<void, std::string>();
	}